

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::performance_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,performance_alert *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&bStack_58,&local_38,": performance warning: ");
  std::operator+(__return_storage_ptr__,&bStack_58,
                 _ZZNK10libtorrent17performance_alert7messageB5cxx11EvE11warning_str_rel +
                 *(int *)(_ZZNK10libtorrent17performance_alert7messageB5cxx11EvE11warning_str_rel +
                         (ulong)this->warning_code * 4));
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string performance_alert::message() const
	{
		static char const* const warning_str[] =
		{
			"max outstanding disk writes reached",
			"max outstanding piece requests reached",
			"upload limit too low (download rate will suffer)",
			"download limit too low (upload rate will suffer)",
			"send buffer watermark too low (upload rate will suffer)",
			"too many optimistic unchoke slots",
			"using bittyrant unchoker with no upload rate limit set",
			"the disk queue limit is too high compared to the cache size. The disk queue eats into the cache size",
			"outstanding AIO operations limit reached",
			"too few ports allowed for outgoing connections",
			"too few file descriptors are allowed for this process. connection limit lowered"
		};

		return torrent_alert::message() + ": performance warning: "
			+ warning_str[warning_code];
	}